

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicScalableKReach.cpp
# Opt level: O3

void __thiscall
DynamicScalableKReach::DynamicPartialIndex::update_remove
          (DynamicPartialIndex *this,vertex_t s,vertex_t t,
          vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
          *graph,vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                 *reverse_graph,vector<unsigned_char,_std::allocator<unsigned_char>_> *dist)

{
  byte *pbVar1;
  pointer puVar2;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar3;
  pointer puVar4;
  ulong uVar5;
  ulong uVar6;
  
  uVar6 = (ulong)s;
  puVar2 = (dist->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_start;
  uVar5 = (long)(dist->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                super__Vector_impl_data._M_finish - (long)puVar2;
  if (uVar6 < uVar5) {
    pbVar1 = puVar2 + uVar6;
    if (*pbVar1 < this->k_) {
      uVar6 = (ulong)t;
      if (uVar5 <= uVar6) goto LAB_0010adf7;
      if ((puVar2[uVar6] <= this->k_) && (*pbVar1 + 1 == (uint)puVar2[uVar6])) {
        pvVar3 = this->updated_;
        puVar4 = (pvVar3->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        if ((pvVar3->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
            super__Vector_impl_data._M_finish != puVar4) {
          (pvVar3->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
          super__Vector_impl_data._M_finish = puVar4;
        }
        collect_changes(this,t,graph,reverse_graph,dist);
        fix_changes(this,graph,reverse_graph,dist);
        return;
      }
    }
    return;
  }
LAB_0010adf7:
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar6,uVar5
            );
}

Assistant:

void DynamicScalableKReach::DynamicPartialIndex::update_remove(vertex_t s, vertex_t t,
                                                               const std::vector<std::vector<vertex_t>> &graph,
                                                               const std::vector<std::vector<vertex_t>> &reverse_graph,
                                                               std::vector<distance_t> &dist) {
    if (dist.at(s) >= k_ || dist.at(t) > k_ || dist.at(s) + 1 != dist.at(t)) {
        return;
    }
    updated_.clear();
    collect_changes(t, graph, reverse_graph, dist);
    fix_changes(graph, reverse_graph, dist);
}